

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

bool dxil_spv::analyze_ags_wmma_store(Impl *impl,StoreInst *store)

{
  ulong uVar1;
  ValueKind VVar2;
  uint uVar3;
  Value *pVVar4;
  Instruction *this;
  key_type this_00;
  LoggingCallback p_Var5;
  void *pvVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  Instruction *this_01;
  __node_base_ptr p_Var11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  SplitScaleBias split;
  AllocaInst *alloca;
  char buffer [4096];
  SplitScaleBias local_1048;
  key_type local_1030;
  char local_1028 [13];
  undefined2 uStack_101b;
  char cStack_1019;
  undefined5 uStack_1018;
  undefined2 uStack_1013;
  undefined1 uStack_1011;
  undefined4 uStack_1010;
  undefined1 uStack_100c;
  undefined2 uStack_100b;
  undefined1 uStack_1009;
  undefined4 uStack_1008;
  undefined1 uStack_1004;
  undefined2 uStack_1003;
  undefined5 uStack_1001;
  undefined1 uStack_ffc;
  undefined2 uStack_ffb;
  
  pVVar4 = LLVMBC::Instruction::getOperand(&store->super_Instruction,0);
  uVar1 = (impl->ags).coopmat_component_mapping._M_h._M_bucket_count;
  uVar8 = (ulong)pVVar4 % uVar1;
  p_Var9 = (impl->ags).coopmat_component_mapping._M_h._M_buckets[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var10 = p_Var9->_M_nxt, p_Var11 = p_Var9, pVVar4 != (Value *)p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var10, p_Var10 = p_Var9->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var10[1]._M_nxt % uVar1 != uVar8) ||
         (p_Var11 = p_Var9, pVVar4 == (Value *)p_Var10[1]._M_nxt)) goto LAB_0017c985;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_0017c985:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var11->_M_nxt;
  }
  if (p_Var10 == (_Hash_node_base *)0x0) {
    return true;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&store->super_Instruction,1);
  if (pVVar4 == (Value *)0x0) {
    this_01 = (Instruction *)0x0;
  }
  else {
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    this_01 = (Instruction *)0x0;
    if (VVar2 == GetElementPtr) {
      this_01 = this;
    }
  }
  if (this_01 == (Instruction *)0x0) {
    p_Var5 = get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      analyze_ags_wmma_store();
      return false;
    }
    uStack_1008 = 0x756f6874;
    uStack_1004 = 0x74;
    uStack_1003 = 0x4720;
    uStack_1001 = 0xa2e5045;
    uStack_1018 = 0x4d4d572061;
    uStack_1013 = 0x2041;
    uStack_1011 = 0x6d;
    uStack_1010 = 0x69727461;
    uStack_100c = 0x78;
    uStack_100b = 0x7720;
    uStack_1009 = 0x69;
    uVar12._0_1_ = 'T';
    uVar12._1_1_ = 'r';
    uVar12._2_1_ = 'y';
    uVar12._3_1_ = 'i';
    uVar13._0_1_ = 'n';
    uVar13._1_1_ = 'g';
    uVar13._2_1_ = ' ';
    uVar13._3_1_ = 't';
    local_1028[8] = 'o';
    local_1028[9] = ' ';
    local_1028[10] = 's';
    local_1028[0xb] = 't';
    uVar14._0_1_ = 'o';
    uVar14._1_1_ = 'r';
    uVar14._2_1_ = 'e';
    uVar14._3_1_ = ' ';
  }
  else {
    pVVar4 = LLVMBC::Instruction::getOperand(this_01,0);
    local_1030 = (key_type)0x0;
    if (pVVar4 != (Value *)0x0) {
      this_00 = (key_type)LLVMBC::Internal::resolve_proxy(pVVar4);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
      local_1030 = (key_type)0x0;
      if (VVar2 == Alloca) {
        local_1030 = this_00;
      }
    }
    if ((local_1030 == (key_type)0x0) ||
       (uVar3 = LLVMBC::Instruction::getNumOperands(this_01), uVar3 < 3)) {
      p_Var5 = get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        analyze_ags_wmma_store();
        return false;
      }
      uStack_1008 = 0x6f6e2067;
      uStack_1004 = 0x74;
      uStack_1003 = 0x4120;
      uStack_1001 = 0x61636f6c6c;
      uStack_ffc = 0x2e;
      uStack_ffb = 10;
      uStack_1018 = 0x20414d4d57;
      uStack_1013 = 0x6f74;
      uStack_1011 = 0x20;
      uStack_1010 = 0x656d6f73;
      uStack_100c = 0x74;
      uStack_100b = 0x6968;
      uStack_1009 = 0x6e;
      uVar12._0_1_ = 'T';
      uVar12._1_1_ = 'r';
      uVar12._2_1_ = 'y';
      uVar12._3_1_ = 'i';
      uVar13._0_1_ = 'n';
      uVar13._1_1_ = 'g';
      uVar13._2_1_ = ' ';
      uVar13._3_1_ = 't';
      local_1028[8] = 'o';
      local_1028[9] = ' ';
      local_1028[10] = 's';
      local_1028[0xb] = 't';
      uVar14._0_1_ = 'o';
      uVar14._1_1_ = 'r';
      uVar14._2_1_ = 'e';
      uVar14._3_1_ = ' ';
    }
    else {
      pVVar4 = LLVMBC::Instruction::getOperand(this_01,2);
      split_index_scale_bias(&local_1048,pVVar4);
      if (local_1048.stride == 0) {
        return false;
      }
      pmVar7 = std::__detail::
               _Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->alloca_ags_tracking,&local_1030);
      if ((pmVar7->override_element_stride != 0) &&
         (local_1048.stride != 0xffffffff && pmVar7->override_element_stride != local_1048.stride))
      {
        p_Var5 = get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          analyze_ags_wmma_store();
          return false;
        }
        local_1028[0] = 'M';
        local_1028[1] = 'i';
        local_1028[2] = 's';
        local_1028[3] = 'm';
        local_1028[4] = 'a';
        local_1028[5] = 't';
        local_1028[6] = 'c';
        local_1028[7] = 'h';
        builtin_strncpy(local_1028 + 8," WMMA",5);
        uStack_101b = 0x7320;
        cStack_1019 = 't';
        uStack_1018 = 0x2e65646972;
        uStack_1013 = 10;
        goto LAB_0017ca92;
      }
      if ((pmVar7->override_element_type != 0) &&
         (pmVar7->override_element_type != *(Id *)&p_Var10[2]._M_nxt)) {
        p_Var5 = get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          analyze_ags_wmma_store();
          return false;
        }
        builtin_strncpy(local_1028,"Mismatch WMMA",0xd);
        uStack_101b = 0x7420;
        cStack_1019 = 'y';
        uStack_1018 = 0xa2e6570;
        goto LAB_0017ca92;
      }
      if (local_1048.stride == 0xffffffff) {
        pmVar7->override_element_stride = 8;
        local_1048.stride = 8;
        local_1048.elem = local_1048.elem & 7;
      }
      if (local_1048.elem == *(uint *)((long)&p_Var10[2]._M_nxt + 4)) {
        if (local_1048.stride != 0xffffffff) {
          pmVar7->override_element_stride = local_1048.stride;
        }
        pmVar7->override_element_type = *(Id *)&p_Var10[2]._M_nxt;
        return true;
      }
      p_Var5 = get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        analyze_ags_wmma_store();
        return false;
      }
      uStack_1008 = 0x414d4d57;
      uStack_1004 = 0x20;
      uStack_1003 = 0x7473;
      uStack_1001 = 0xa2e65726f;
      uStack_ffc = 0;
      uStack_1018 = 0x20746e656e;
      uStack_1013 = 0x616d;
      uStack_1011 = 0x70;
      uStack_1010 = 0x676e6970;
      uStack_100c = 0x20;
      uStack_100b = 0x6e69;
      uStack_1009 = 0x20;
      uVar12._0_1_ = 'U';
      uVar12._1_1_ = 'n';
      uVar12._2_1_ = 'e';
      uVar12._3_1_ = 'x';
      uVar13._0_1_ = 'p';
      uVar13._1_1_ = 'e';
      uVar13._2_1_ = 'c';
      uVar13._3_1_ = 't';
      local_1028[8] = 'e';
      local_1028[9] = 'd';
      local_1028[10] = ' ';
      local_1028[0xb] = 'c';
      uVar14._0_1_ = 'o';
      uVar14._1_1_ = 'm';
      uVar14._2_1_ = 'p';
      uVar14._3_1_ = 'o';
    }
  }
  local_1028[4] = (char)uVar13;
  local_1028[5] = SUB41(uVar13,1);
  local_1028[6] = SUB41(uVar13,2);
  local_1028[7] = SUB41(uVar13,3);
  local_1028[0] = (char)uVar12;
  local_1028[1] = SUB41(uVar12,1);
  local_1028[2] = SUB41(uVar12,2);
  local_1028[3] = SUB41(uVar12,3);
  local_1028[0xc] = (char)uVar14;
  uStack_101b = SUB42(uVar14,1);
  cStack_1019 = SUB41(uVar14,3);
LAB_0017ca92:
  pvVar6 = get_thread_log_callback_userdata();
  (*p_Var5)(pvVar6,Error,local_1028);
  return false;
}

Assistant:

bool analyze_ags_wmma_store(Converter::Impl &impl, const llvm::StoreInst *store)
{
	auto itr = impl.ags.coopmat_component_mapping.find(store->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end())
		return true;

	const auto *gep = llvm::dyn_cast<llvm::GetElementPtrInst>(store->getOperand(1));
	if (!gep)
	{
		LOGE("Trying to store a WMMA matrix without GEP.\n");
		return false;
	}

	auto *alloca = llvm::dyn_cast<llvm::AllocaInst>(gep->getOperand(0));
	if (!alloca || gep->getNumOperands() < 3)
	{
		LOGE("Trying to store WMMA to something not Alloca.\n");
		return false;
	}

	const auto *index = gep->getOperand(2);
	auto split = split_index_scale_bias(index);
	if (!split.stride)
		return false;

	auto &tracking = impl.alloca_ags_tracking[alloca];
	if (tracking.override_element_stride &&
	    tracking.override_element_stride != split.stride &&
	    split.stride != UINT32_MAX)
	{
		LOGE("Mismatch WMMA stride.\n");
		return false;
	}

	if (tracking.override_element_type && tracking.override_element_type != itr->second.type_id)
	{
		LOGE("Mismatch WMMA type.\n");
		return false;
	}

	if (split.stride == UINT32_MAX)
	{
		// Somewhat hacky, but this is the AGS assumption.
		tracking.override_element_stride = 8;

#if 0
		// This breaks in some cases.
		if (split.elem > itr->second.component)
		{
			if (tracking.override_element_stride == 0)
			{
				// We can deduce stride from this.
				tracking.override_element_stride = split.elem - itr->second.component;
			}
			else
			{
				// This isn't perfect if there are gaps in the writes, but we can assume that's not the case.
				tracking.override_element_stride =
					std::min<uint32_t>(split.elem - itr->second.component,
									   tracking.override_element_stride);
			}
		}
#endif
	}

	if (split.stride == UINT32_MAX && tracking.override_element_stride)
	{
		split.stride = tracking.override_element_stride;
		split.elem %= split.stride;
	}

	// If we have constant indices we don't know how the mapping works yet.
	if (split.elem != itr->second.component)
	{
		LOGE("Unexpected component mapping in WMMA store.\n");
		return false;
	}

	if (split.stride != UINT32_MAX)
		tracking.override_element_stride = split.stride;
	tracking.override_element_type = itr->second.type_id;
	return true;
}